

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
Resize(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
       *this,hash_t nhsize)

{
  Node *block;
  Node *pNVar1;
  ulong uVar2;
  FOptionalMapinfoDataPtr *p;
  bool bVar3;
  FName local_2c;
  
  uVar2 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  p = &(block->Pair).Value;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    if (*(long *)(p + -2) != 1) {
      local_2c.Index = (((IPair *)(p + -1))->Key).Index;
      pNVar1 = NewKey(this,&local_2c);
      FOptionalMapinfoDataPtr::FOptionalMapinfoDataPtr(&(pNVar1->Pair).Value,p);
      if (p->Ptr != (FOptionalMapinfoData *)0x0) {
        (*p->Ptr->_vptr_FOptionalMapinfoData[1])();
      }
    }
    p = p + 3;
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}